

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2Bug1816809(void)

{
  bool bVar1;
  string x;
  StringPiece piece;
  RE2 re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  StringPiece local_278;
  RE2 local_268;
  LogMessageFatal local_188;
  
  RE2::RE2(&local_268,"(((((llx((-3)|(4)))(;(llx((-3)|(4))))*))))");
  local_278.ptr_ = "llx-3;llx4";
  local_278.length_ = 10;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_188.super_LogMessage._0_8_ = &local_298;
  bVar1 = RE2::Consume<std::__cxx11::string*>
                    (&local_278,&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_188);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c1);
    std::operator<<((ostream *)((long)&local_188 + 8),"Check failed: RE2::Consume(&piece, re, &x)");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  std::__cxx11::string::~string((string *)&local_298);
  RE2::~RE2(&local_268);
  return;
}

Assistant:

TEST(RE2, Bug1816809) {
  RE2 re("(((((llx((-3)|(4)))(;(llx((-3)|(4))))*))))");
  StringPiece piece("llx-3;llx4");
  string x;
  EXPECT_TRUE(RE2::Consume(&piece, re, &x));
}